

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BARef::resize(BARef *this,Long n)

{
  long in_RDI;
  
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::resize
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,n);
  std::
  unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear((unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)0xfb350e);
  *(undefined1 *)(in_RDI + 0x78) = 0;
  return;
}

Assistant:

void
BARef::resize (Long n) {
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(-1);
    updateMemoryUsage_hash(-1);
#endif
    m_abox.resize(n);
    hash.clear();
    has_hashmap = false;
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}